

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  SortSubtask *pTask;
  int *piVar1;
  uint uVar2;
  int iVar3;
  u8 *pKey2;
  PmaReader *pPVar4;
  uint uVar5;
  ulong uVar6;
  PmaReader *pPVar7;
  PmaReader *pPVar8;
  
  pTask = pMerger->pTask;
  uVar5 = pMerger->aTree[1];
  uVar2 = vdbePmaReaderNext(pMerger->aReadr + (int)uVar5);
  if (uVar2 == 0) {
    pPVar7 = pMerger->aReadr;
    pPVar4 = pPVar7 + (uVar5 & 0xfffe);
    pPVar8 = pPVar7 + (int)(uVar5 | 1);
    pKey2 = pPVar7[(int)(uVar5 | 1)].aKey;
    uVar6 = (long)(int)(uVar5 + pMerger->nTree) / 2 & 0xffffffff;
    while (uVar5 = (uint)uVar6, 0 < (int)uVar5) {
      if (pPVar4->pFd == (sqlite3_file *)0x0) {
LAB_00134ea4:
        piVar1 = pMerger->aTree;
        piVar1[uVar6] = (int)(((long)pPVar8 - (long)pPVar7) / 0x50);
        pPVar4 = pPVar7 + piVar1[uVar5 ^ 1];
      }
      else {
        if (pPVar8->pFd != (sqlite3_file *)0x0) {
          iVar3 = vdbeSorterCompare(pTask,pPVar4->aKey,pPVar4->nKey,pKey2,pPVar8->nKey);
          if (iVar3 < 0) {
            pPVar7 = pMerger->aReadr;
          }
          else {
            pPVar7 = pMerger->aReadr;
            if ((iVar3 != 0) || (pPVar8 <= pPVar4)) {
              if (pPVar4->pFd != (sqlite3_file *)0x0) {
                pKey2 = (u8 *)0x0;
              }
              goto LAB_00134ea4;
            }
          }
        }
        piVar1 = pMerger->aTree;
        piVar1[uVar6] = (int)(((long)pPVar4 - (long)pPVar7) / 0x50);
        iVar3 = piVar1[uVar5 ^ 1];
        pPVar8 = pPVar7 + iVar3;
        pKey2 = pPVar7[iVar3].aKey;
      }
      uVar6 = (ulong)(uVar5 >> 1);
    }
    *pbEof = (uint)(pPVar7[pMerger->aTree[1]].pFd == (sqlite3_file *)0x0);
    uVar2 = (uint)pTask->pUnpacked->errCode;
  }
  return uVar2;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    u8 *pKey2;                  /* To pReadr2->aKey, or 0 if record cached */

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];
    pKey2 = pReadr2->aKey;

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = vdbeSorterCompare(pTask, 
            pReadr1->aKey, pReadr1->nKey, pKey2, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        pKey2 = pReadr2->aKey;
      }else{
        if( pReadr1->pFd ) pKey2 = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}